

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casts.h
# Opt level: O3

void __thiscall
CoreML::Specification::LoopLayerParams::CheckTypeAndMergeFrom
          (LoopLayerParams *this,MessageLite *from)

{
  ulong uVar1;
  uint64_t uVar2;
  LogMessage *other;
  NeuralNetwork *pNVar3;
  undefined8 *puVar4;
  ulong uVar5;
  undefined1 *puVar6;
  Arena *pAVar7;
  LogFinisher LStack_51;
  LogMessage LStack_50;
  
  if (from->_vptr_MessageLite != (_func_int **)&PTR__LoopLayerParams_00487a78) {
    __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/casts.h"
                  ,0x5e,
                  "To google::protobuf::internal::down_cast(From *) [To = const CoreML::Specification::LoopLayerParams *, From = const google::protobuf::MessageLite]"
                 );
  }
  if ((LoopLayerParams *)from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&LStack_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x4979);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&LStack_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&LStack_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&LStack_50);
  }
  uVar5 = (ulong)from[1]._vptr_MessageLite & 0xfffffffffffffffe;
  if (*(long *)(uVar5 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar4 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar4 = (undefined8 *)*puVar4;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->conditionvar_,uVar5,puVar4);
  }
  puVar6 = (undefined1 *)from[1]._internal_metadata_.ptr_;
  if ((NeuralNetwork *)puVar6 != (NeuralNetwork *)0x0 &&
      from != (MessageLite *)_LoopLayerParams_default_instance_) {
    pNVar3 = this->conditionnetwork_;
    if (pNVar3 == (NeuralNetwork *)0x0) {
      uVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar7 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar7 = *(Arena **)pAVar7;
      }
      pNVar3 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>
                         (pAVar7);
      this->conditionnetwork_ = pNVar3;
      puVar6 = (undefined1 *)from[1]._internal_metadata_.ptr_;
    }
    if ((NeuralNetwork *)puVar6 == (NeuralNetwork *)0x0) {
      puVar6 = _NeuralNetwork_default_instance_;
    }
    NeuralNetwork::MergeFrom(pNVar3,(NeuralNetwork *)puVar6);
  }
  puVar6 = (undefined1 *)from[2]._vptr_MessageLite;
  if ((NeuralNetwork *)puVar6 != (NeuralNetwork *)0x0 &&
      from != (MessageLite *)_LoopLayerParams_default_instance_) {
    pNVar3 = this->bodynetwork_;
    if (pNVar3 == (NeuralNetwork *)0x0) {
      uVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar7 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar7 = *(Arena **)pAVar7;
      }
      pNVar3 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>
                         (pAVar7);
      this->bodynetwork_ = pNVar3;
      puVar6 = (undefined1 *)from[2]._vptr_MessageLite;
    }
    if ((NeuralNetwork *)puVar6 == (NeuralNetwork *)0x0) {
      puVar6 = _NeuralNetwork_default_instance_;
    }
    NeuralNetwork::MergeFrom(pNVar3,(NeuralNetwork *)puVar6);
  }
  uVar2 = from[2]._internal_metadata_.ptr_;
  if (uVar2 != 0) {
    this->maxloopiterations_ = uVar2;
  }
  uVar5 = (from->_internal_metadata_).ptr_;
  if ((uVar5 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar5 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

inline To down_cast(From* f) {                   // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  if (false) {
    implicit_cast<From*, To>(0);
  }

#if !defined(NDEBUG) && PROTOBUF_RTTI
  assert(f == nullptr || dynamic_cast<To>(f) != nullptr);  // RTTI: debug mode only!
#endif
  return static_cast<To>(f);
}